

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glGetVertexShaderUniformB(uint idx,int *data,uint bcount)

{
  uint8 *puVar1;
  uint uVar2;
  uint8 *endptr;
  uint8 *rptr;
  uint maxregs;
  uint bcount_local;
  int *data_local;
  uint idx_local;
  
  if (idx < 0x1ff) {
    puVar1 = ctx->vs_reg_file_b;
    uVar2 = minuint(0x1ff - idx,bcount);
    endptr = puVar1 + idx;
    _maxregs = (uint *)data;
    while (endptr != puVar1 + idx + uVar2) {
      *_maxregs = (uint)*endptr;
      endptr = endptr + 1;
      _maxregs = _maxregs + 1;
    }
  }
  return;
}

Assistant:

void MOJOSHADER_glGetVertexShaderUniformB(unsigned int idx, int *data,
                                          unsigned int bcount)
{
    const uint maxregs = STATICARRAYLEN(ctx->vs_reg_file_b) / 4;
    if (idx < maxregs)
    {
        uint8 *rptr = ctx->vs_reg_file_b + idx;
        uint8 *endptr = rptr + minuint(maxregs - idx, bcount);
        while (rptr != endptr)
            *(data++) = (int) *(rptr++);
    } // if
}